

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Stream::transitionState(QHttp2Stream *this,StateTransition transition)

{
  State newState;
  
  switch(*(undefined4 *)(this + 0x68)) {
  case 0:
    newState = Open;
    break;
  case 1:
    if (transition == RST) {
      newState = Closed;
    }
    else {
      if (transition != CloseLocal) {
        return;
      }
      newState = HalfClosedLocal;
    }
    break;
  case 2:
    if (2 < transition - CloseLocal) {
      return;
    }
    newState = transition + CloseRemote;
    break;
  case 3:
    newState = Closed;
    if ((transition & ~CloseLocal) != CloseRemote) {
      return;
    }
    break;
  case 4:
    newState = Closed;
    if ((transition & ~CloseRemote) != CloseLocal) {
      return;
    }
    break;
  default:
    return;
  }
  setState(this,newState);
  return;
}

Assistant:

void QHttp2Stream::transitionState(StateTransition transition)
{
    switch (m_state) {
    case State::Idle:
        if (transition == StateTransition::Open)
            setState(State::Open);
        else
            Q_UNREACHABLE(); // We should transition to Open before ever getting here
        break;
    case State::Open:
        switch (transition) {
        case StateTransition::CloseLocal:
            setState(State::HalfClosedLocal);
            break;
        case StateTransition::CloseRemote:
            setState(State::HalfClosedRemote);
            break;
        case StateTransition::RST:
            setState(State::Closed);
            break;
        case StateTransition::Open: // no-op
            break;
        }
        break;
    case State::HalfClosedLocal:
        if (transition == StateTransition::CloseRemote || transition == StateTransition::RST)
            setState(State::Closed);
        break;
    case State::HalfClosedRemote:
        if (transition == StateTransition::CloseLocal || transition == StateTransition::RST)
            setState(State::Closed);
        break;
    case State::ReservedRemote:
        if (transition == StateTransition::RST) {
            setState(State::Closed);
        } else if (transition == StateTransition::CloseLocal) { // Receiving HEADER closes local
            setState(State::HalfClosedLocal);
        }
        break;
    case State::Closed:
        break;
    }
}